

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_handshake_api(void)

{
  int iVar1;
  int iVar2;
  ptls_t *ppVar3;
  void **ppvVar4;
  ptls_iovec_t pVar5;
  size_t local_7f8;
  size_t inlen;
  undefined1 local_770 [16];
  uint8_t *local_760;
  size_t local_758;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr **local_750;
  undefined1 local_6f0 [16];
  uint8_t *local_6e0;
  size_t local_6d8;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr **local_6d0;
  undefined1 local_670 [8];
  ptls_handshake_properties_t server_hs_prop;
  undefined1 local_570 [8];
  ptls_handshake_properties_t client_hs_prop;
  size_t max_early_data_size;
  size_t local_4e0;
  code *pcStack_4d0;
  int ret;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  ptls_update_traffic_key_t update_traffic_key;
  size_t soffs [5];
  size_t local_488;
  size_t coffs [5];
  undefined1 local_458 [8];
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  traffic_secrets_t server_secrets;
  traffic_secrets_t client_secrets;
  ptls_t *server;
  ptls_t *client;
  
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  encrypt_ticket.cb = on_update_traffic_key;
  save_ticket.cb = on_copy_ticket;
  pcStack_4d0 = on_save_ticket;
  ctx->private_key_method = &private_key_method;
  ctx_peer->private_key_method = &private_key_method;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)&encrypt_ticket;
  ctx->field_0x68 = ctx->field_0x68 & 0xef | 0x10;
  ctx->save_ticket = (ptls_save_ticket_t *)&stack0xfffffffffffffb30;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)&encrypt_ticket;
  ctx_peer->field_0x68 = ctx_peer->field_0x68 & 0xef | 0x10;
  ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)&save_ticket;
  ctx_peer->ticket_lifetime = 0x15180;
  ctx_peer->max_early_data_size = 0x2000;
  pVar5 = ptls_iovec_init((void *)0x0,0);
  max_early_data_size = (size_t)pVar5.base;
  saved_ticket.base = (uint8_t *)max_early_data_size;
  local_4e0 = pVar5.len;
  saved_ticket.len = local_4e0;
  ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)local_458,"",0);
  ppVar3 = ptls_new(ctx,0);
  ppvVar4 = ptls_get_data_ptr(ppVar3);
  *ppvVar4 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar4 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar4 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x503);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x505);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x506);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x507);
  iVar1 = memcmp(server_secrets[1][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x508);
  iVar1 = memcmp(server_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x509);
  iVar1 = memcmp(server_secrets[0][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50a);
  iVar1 = memcmp(server_secrets[0][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50b);
  iVar1 = feed_messages(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50d);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50e);
  iVar1 = ptls_handshake_is_complete(ppVar3);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50f);
  iVar1 = memcmp(client_secrets[0][1] + 0x38,server_secrets[1][1] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x510);
  iVar1 = memcmp(client_secrets[1][1] + 0x38,server_secrets[0][1] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x511);
  iVar1 = memcmp(client_secrets[0][2] + 0x38,server_secrets[1][2] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x512);
  iVar1 = memcmp(client_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x513);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x515);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x516);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x517);
  iVar1 = memcmp(client_secrets[1][2] + 0x38,server_secrets[0][2] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x518);
  ptls_free(ppVar3);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  memset(&update_traffic_key,0,0x28);
  ctx->save_ticket = (ptls_save_ticket_t *)0x0;
  client_hs_prop.collected_extensions =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
  memset(local_570,0,0x80);
  client_hs_prop.field_0.client.negotiated_protocols.count = (size_t)saved_ticket.base;
  client_hs_prop.field_0.client.session_ticket.base = (uint8_t *)saved_ticket.len;
  client_hs_prop.field_0.client.session_ticket.len = (size_t)&client_hs_prop.collected_extensions;
  ppVar3 = ptls_new(ctx,0);
  ppvVar4 = ptls_get_data_ptr(ppVar3);
  *ppvVar4 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar4 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar4 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x52e);
  _ok((uint)(client_hs_prop.collected_extensions !=
            (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0)
      ,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
      0x52f);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x530);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x532);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x533);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x534);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,server_secrets[0][0] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x535);
  iVar1 = memcmp(server_secrets[0][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x536);
  iVar1 = memcmp(server_secrets[1][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x537);
  iVar1 = memcmp(server_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x538);
  iVar1 = memcmp(server_secrets[0][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x539);
  iVar1 = feed_messages(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53b);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53c);
  iVar1 = ptls_handshake_is_complete(ppVar3);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53d);
  iVar1 = memcmp(client_secrets[0][2] + 0x38,server_secrets[1][2] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53e);
  iVar1 = memcmp(client_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53f);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x541);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x542);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x543);
  iVar1 = memcmp(server_secrets[0][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x544);
  ptls_free(ppVar3);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  memset(&update_traffic_key,0,0x28);
  ctx_peer->max_early_data_size = 0;
  memset(&server_hs_prop.collected_extensions,0,0x80);
  memcpy(local_570,&server_hs_prop.collected_extensions,0x80);
  ppVar3 = ptls_new(ctx,0);
  ppvVar4 = ptls_get_data_ptr(ppVar3);
  *ppvVar4 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar4 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar4 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x558);
  _ok((uint)(client_hs_prop.collected_extensions !=
            (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0)
      ,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
      0x559);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55a);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55c);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55d);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55e);
  iVar1 = feed_messages(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x560);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x561);
  iVar1 = ptls_handshake_is_complete(ppVar3);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x562);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x563);
  iVar1 = memcmp(server_secrets[0][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x564);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x566);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x567);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x568);
  ptls_free(ppVar3);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  memset(&update_traffic_key,0,0x28);
  ctx_peer->max_early_data_size = 0x2000;
  memset(local_670,0,0x80);
  server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ =
       server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ & 0xfe | 1;
  memset(local_6f0,0,0x80);
  local_6e0 = saved_ticket.base;
  local_6d8 = saved_ticket.len;
  local_6d0 = &client_hs_prop.collected_extensions;
  memcpy(local_570,local_6f0,0x80);
  ppVar3 = ptls_new(ctx,0);
  ppvVar4 = ptls_get_data_ptr(ppVar3);
  *ppvVar4 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar4 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar4 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x57e);
  _ok((uint)(client_hs_prop.collected_extensions !=
            (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0)
      ,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
      0x57f);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x580);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)local_670);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x582);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x583);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x584);
  iVar1 = feed_messages(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x586);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x587);
  iVar1 = ptls_handshake_is_complete(ppVar3);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x588);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x589);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)local_670);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58b);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58c);
  iVar1 = memcmp(server_secrets[0][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58d);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58e);
  iVar1 = feed_messages(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x590);
  iVar1 = ptls_handshake_is_complete(ppVar3);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x591);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x592);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)local_670);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x594);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x595);
  ptls_free(ppVar3);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx->field_0x68 = ctx->field_0x68 & 0xef;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx_peer->field_0x68 = ctx_peer->field_0x68 & 0xef;
  memset(local_770,0,0x80);
  local_760 = saved_ticket.base;
  local_758 = saved_ticket.len;
  local_750 = &client_hs_prop.collected_extensions;
  memcpy(local_570,local_770,0x80);
  memset(&inlen,0,0x80);
  memcpy(local_670,&inlen,0x80);
  server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ =
       server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ & 0xfe | 1;
  ppVar3 = ptls_new(ctx,0);
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  iVar1 = ptls_handshake(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5a8);
  _ok((uint)(client_hs_prop.field_0.client.session_ticket.len != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5a9);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5aa);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ab);
  iVar1 = ptls_send(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ad);
  local_7f8 = cbuf.capacity;
  iVar1 = ptls_handshake((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                         (void *)sbuf._24_8_,&local_7f8,(ptls_handshake_properties_t *)local_670);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b0);
  _ok((uint)(cbuf.capacity == local_7f8),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b1);
  cbuf.capacity = 0;
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b3);
  local_7f8 = sbuf.capacity;
  iVar1 = ptls_handshake(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,(void *)local_458,&local_7f8,
                         (ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b6);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b7);
  _ok((uint)(sbuf.capacity == local_7f8),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b8);
  sbuf.capacity = 0;
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ba);
  local_7f8 = cbuf.capacity;
  do {
    iVar1 = ptls_handshake((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                           (void *)sbuf._24_8_,&local_7f8,(ptls_handshake_properties_t *)local_670);
    iVar2 = ptls_handshake_in_private_key((ptls_t *)client_secrets[1][3]._56_8_);
  } while (iVar2 != 0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5bf);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c0);
  _ok((uint)(cbuf.capacity == local_7f8),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c1);
  cbuf.capacity = 0;
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c3);
  local_7f8 = sbuf.capacity;
  iVar1 = ptls_handshake(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,(void *)local_458,&local_7f8,
                         (ptls_handshake_properties_t *)local_570);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c6);
  iVar1 = ptls_handshake_is_complete(ppVar3);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c7);
  _ok((uint)(local_7f8 < sbuf.capacity),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c8);
  sbuf.capacity = 0;
  local_7f8 = cbuf.capacity;
  do {
    iVar1 = ptls_handshake((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                           (void *)sbuf._24_8_,&local_7f8,(ptls_handshake_properties_t *)local_670);
    iVar2 = ptls_handshake_in_private_key((ptls_t *)client_secrets[1][3]._56_8_);
  } while (iVar2 != 0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ce);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5cf);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5d0);
  ptls_free(ppVar3);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)local_458);
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx->field_0x68 = ctx->field_0x68 & 0xef;
  ctx->save_ticket = (ptls_save_ticket_t *)0x0;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx_peer->field_0x68 = ctx_peer->field_0x68 & 0xef;
  ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ctx_peer->save_ticket = (ptls_save_ticket_t *)0x0;
  ctx_peer->ticket_lifetime = 0;
  ctx_peer->max_early_data_size = 0;
  return;
}

Assistant:

static void test_handshake_api(void)
{
    ptls_t *client, *server;
    traffic_secrets_t client_secrets = {{{0}}}, server_secrets = {{{0}}};
    ptls_buffer_t cbuf, sbuf;
    size_t coffs[5] = {0}, soffs[5];
    ptls_update_traffic_key_t update_traffic_key = {on_update_traffic_key};
    ptls_encrypt_ticket_t encrypt_ticket = {on_copy_ticket};
    ptls_save_ticket_t save_ticket = {on_save_ticket};
    int ret;

    ctx->private_key_method = &private_key_method;
    ctx_peer->private_key_method = &private_key_method;

    ctx->update_traffic_key = &update_traffic_key;
    ctx->omit_end_of_early_data = 1;
    ctx->save_ticket = &save_ticket;
    ctx_peer->update_traffic_key = &update_traffic_key;
    ctx_peer->omit_end_of_early_data = 1;
    ctx_peer->encrypt_ticket = &encrypt_ticket;
    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;

    saved_ticket = ptls_iovec_init(NULL, 0);

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);

    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;

    /* full handshake */
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][2], server_secrets[1][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][2], server_secrets[0][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][3], server_secrets[0][3], PTLS_MAX_DIGEST_SIZE) == 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    ctx->save_ticket = NULL; /* don't allow further test to update the saved ticket */

    /* 0-RTT resumption */
    size_t max_early_data_size = 0;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][1], server_secrets[0][1], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0); /* !!!overlap!!! */
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* 0-RTT rejection */
    ctx_peer->max_early_data_size = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* HRR rejects 0-RTT */
    ctx_peer->max_early_data_size = 8192;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* HRR  -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);
    ok(!ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> SH..SF */
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ok(sbuf.off != 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(cbuf.off != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CF -> */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;

    /* shamelessly reuse this subtest for testing ordinary TLS 0-RTT with HRR rejection */
    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    server_hs_prop = (ptls_handshake_properties_t){{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.max_early_data_size != 0);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
    ok(cbuf.off != 0);
    ret = ptls_send(client, &cbuf, "hello world", 11); /* send 0-RTT data that'll be rejected */
    ok(ret == 0);
    size_t inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* HRR -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(sbuf.off == inlen);
    sbuf.off = 0;
    ok(cbuf.off != 0);
    inlen = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> SH..SF,NST */
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(inlen < sbuf.off); /* ignore NST */
    sbuf.off = 0;
    inlen = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CF -> */
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));
    ok(sbuf.off == 0);

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);

    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx->save_ticket = NULL;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx_peer->save_ticket = NULL;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
}